

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall libtorrent::aux::bt_peer_connection::write_choke(bt_peer_connection *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  
  iVar1 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xc])();
  if ((char)iVar1 == '\0') {
    send_message<>(this,msg_choke,num_outgoing_choke);
    for (p_Var2 = (this->super_peer_connection).m_extensions.
                  super__List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 != (_List_node_base *)&(this->super_peer_connection).m_extensions;
        p_Var2 = p_Var2->_M_next) {
      (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0xf0))();
    }
  }
  return;
}

Assistant:

void bt_peer_connection::write_choke()
	{
		INVARIANT_CHECK;

		if (is_choked()) return;
		send_message(msg_choke, counters::num_outgoing_choke);

#ifndef TORRENT_DISABLE_EXTENSIONS
		extension_notify(&peer_plugin::sent_choke);
#endif
	}